

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O3

void av1_temporal_filter(AV1_COMP *cpi,int filter_frame_lookahead_idx,int gf_frame_index,
                        FRAME_DIFF *frame_diff,YV12_BUFFER_CONFIG *output_frame)

{
  double *noise_level;
  TemporalFilterData *pTVar1;
  scale_factors *sf;
  uint8_t **ppuVar2;
  FRAME_UPDATE_TYPE FVar3;
  FRAME_TYPE FVar4;
  AV1_PRIMARY *pAVar5;
  SequenceHeader *pSVar6;
  YV12_BUFFER_CONFIG *pYVar7;
  MB_MODE_INFO **ppMVar8;
  ulong uVar9;
  double dVar10;
  int64_t iVar11;
  byte bVar12;
  byte bVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  lookahead_entry *frame;
  byte *pbVar19;
  lookahead_entry *plVar20;
  MB_MODE_INFO *pMVar21;
  uint32_t *puVar22;
  uint16_t *puVar23;
  void *pvVar24;
  uint8_t *puVar25;
  buf_2d *pbVar26;
  long lVar27;
  FIRSTPASS_STATS *pFVar28;
  FIRSTPASS_STATS *pFVar29;
  ulong uVar30;
  long lVar31;
  int *piVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  size_t size;
  uint b_frames;
  uint uVar36;
  ThreadData_conflict *td;
  bool bVar37;
  double dVar38;
  int iVar39;
  double dVar40;
  double dVar41;
  uint8_t *input_buffer [3];
  undefined8 auStack_48 [3];
  
  (cpi->tf_ctx).num_frames = 0;
  (cpi->tf_ctx).filter_frame_idx = -1;
  (cpi->tf_ctx).output_frame = output_frame;
  (cpi->tf_ctx).compute_frame_diff = (uint)(frame_diff != (FRAME_DIFF *)0x0);
  pAVar5 = cpi->ppi;
  FVar3 = (pAVar5->gf_group).update_type[gf_frame_index];
  FVar4 = (pAVar5->gf_group).frame_type[gf_frame_index];
  iVar14 = av1_gop_check_forward_keyframe(&pAVar5->gf_group,gf_frame_index);
  iVar17 = (cpi->oxcf).algo_cfg.arnr_max_frames;
  iVar39 = 1;
  if (1 < iVar17) {
    iVar39 = iVar17;
  }
  uVar15 = av1_lookahead_depth(cpi->ppi->lookahead,cpi->compressor_stage);
  uVar33 = (cpi->rc).frames_since_key + filter_frame_lookahead_idx;
  if ((int)uVar33 < 1) {
    uVar33 = 0;
  }
  uVar16 = uVar15 + ~filter_frame_lookahead_idx;
  b_frames = ~filter_frame_lookahead_idx + (cpi->rc).frames_to_key;
  if ((int)b_frames < 1) {
    b_frames = 0;
  }
  uVar35 = (ulong)uVar33;
  if (filter_frame_lookahead_idx <= (int)uVar33) {
    uVar35 = (ulong)(uint)filter_frame_lookahead_idx;
  }
  uVar33 = (uint)uVar35;
  if ((int)uVar16 < (int)b_frames) {
    b_frames = uVar16;
  }
  frame = av1_lookahead_peek(cpi->ppi->lookahead,filter_frame_lookahead_idx,cpi->compressor_stage);
  pSVar6 = (cpi->common).seq_params;
  bVar37 = pSVar6->monochrome == '\0';
  noise_level = (cpi->tf_ctx).noise_levels;
  av1_estimate_noise_level(&frame->img,noise_level,0,(uint)bVar37 * 2,pSVar6->bit_depth,0x32);
  dVar38 = av1_convert_qindex_to_q
                     ((cpi->ppi->p_rc).avg_frame_qindex
                      [(cpi->ppi->gf_group).frame_type[cpi->gf_frame_index]],
                      ((cpi->common).seq_params)->bit_depth);
  uVar9 = (ulong)((cpi->rc).frames_since_key == 0);
  pFVar28 = (cpi->twopass_frame).stats_in;
  if ((int)b_frames < 1) {
    bVar13 = 0;
    dVar41 = 1.0;
  }
  else {
    pFVar29 = pFVar28 + (long)filter_frame_lookahead_idx + 1;
    dVar41 = 1.0;
    lVar31 = 0;
    do {
      if (((cpi->ppi->twopass).stats_buf_ctx)->stats_in_end <= pFVar29 + -uVar9) {
        b_frames = -(int)lVar31;
        break;
      }
      dVar40 = pFVar29[-uVar9].cor_coeff;
      if (pFVar29[-uVar9].cor_coeff <= 0.001) {
        dVar40 = 0.001;
      }
      dVar41 = dVar41 * dVar40;
      lVar31 = lVar31 + -1;
      pFVar29 = pFVar29 + 1;
    } while (1 - (ulong)(b_frames + 1) != lVar31);
    if ((int)b_frames < 1) {
      bVar13 = 0;
    }
    else {
      dVar41 = pow(dVar41,1.0 / (double)(int)b_frames);
      bVar13 = 1;
    }
  }
  dVar40 = 1.0;
  uVar16 = 0;
  if ((int)uVar33 < 1) {
    bVar12 = 0;
  }
  else {
    pFVar28 = pFVar28 + filter_frame_lookahead_idx;
    dVar40 = 1.0;
    uVar30 = 0;
    do {
      if (pFVar28 + -uVar9 <= ((cpi->ppi->twopass).stats_buf_ctx)->stats_in_start) {
        uVar33 = (uint)uVar30;
        break;
      }
      dVar10 = pFVar28[-uVar9].cor_coeff;
      if (pFVar28[-uVar9].cor_coeff <= 0.001) {
        dVar10 = 0.001;
      }
      dVar40 = dVar40 * dVar10;
      uVar30 = uVar30 + 1;
      pFVar28 = pFVar28 + -1;
    } while (uVar35 != uVar30);
    if ((int)uVar33 < 1) {
      bVar12 = 0;
    }
    else {
      dVar40 = pow(dVar40,1.0 / (double)(int)uVar33);
      bVar12 = 1;
    }
  }
  if (((1 < iVar17) &&
      (((iVar17 = (cpi->sf).hl_sf.adjust_num_frames_for_arf_filtering, FVar3 != '\0' ||
        (10 < (int)dVar38)) && (uVar16 = 6, FVar3 != '\0' && 0 < iVar17)))) &&
     (0 < (cpi->rc).frames_since_key)) {
    lVar31 = (ulong)(iVar17 - 1) * 3;
    pbVar19 = &DAT_00505880 + lVar31;
    dVar38 = *noise_level;
    if (0.5 <= dVar38) {
      if (1.0 <= dVar38) {
        pbVar19 = &DAT_00505882 + lVar31;
      }
      else {
        pbVar19 = &DAT_00505881 + lVar31;
      }
    }
    uVar16 = (uint)*pbVar19;
  }
  uVar18 = uVar16 + iVar39;
  if ((int)uVar15 <= (int)(uVar16 + iVar39)) {
    uVar18 = uVar15;
  }
  if (FVar4 == '\0') {
    uVar15 = (int)uVar18 / 2;
    if (iVar14 == 0) {
      uVar15 = 0;
    }
    if ((int)uVar33 <= (int)uVar15) {
      uVar15 = uVar33;
    }
    uVar16 = uVar18 - 1;
    if ((int)b_frames <= (int)(uVar18 - 1)) {
      uVar16 = b_frames;
    }
  }
  else {
    iVar17 = av1_calc_arf_boost(&cpi->ppi->twopass,&cpi->twopass_frame,&cpi->ppi->p_rc,
                                &cpi->frame_info,filter_frame_lookahead_idx,uVar33,b_frames,
                                (int *)0x0,(int *)0x0,0);
    uVar15 = iVar17 / 0x96;
    if ((int)uVar18 < iVar17 / 0x96) {
      uVar15 = uVar18;
    }
    uVar15 = uVar15 | 1;
    uVar18 = 3;
    if ((int)uVar15 < 3) {
      uVar18 = uVar15;
    }
    if (FVar3 != '\x06') {
      uVar18 = uVar15;
    }
    uVar34 = uVar33;
    if ((int)b_frames < (int)uVar33) {
      uVar34 = b_frames;
    }
    uVar15 = (int)uVar18 / 2;
    uVar16 = uVar15;
    if ((int)uVar34 < (int)uVar15) {
      uVar34 = uVar33;
      uVar36 = b_frames;
      if ((int)b_frames < (int)uVar15) {
        uVar34 = uVar18 + ~b_frames;
        if ((int)uVar33 <= (int)(uVar18 + ~b_frames)) {
          uVar34 = uVar33;
        }
      }
      else {
        uVar36 = uVar18 + ~uVar33;
        if ((int)b_frames <= (int)(uVar18 + ~uVar33)) {
          uVar36 = b_frames;
        }
      }
      uVar15 = uVar34;
      uVar16 = uVar36;
      if ((bool)(bVar13 & bVar12)) {
        if ((int)uVar36 < (int)uVar34) {
          dVar41 = 1.0 - dVar41;
          if (dVar41 <= 0.01) {
            dVar41 = 0.01;
          }
          uVar15 = (int)(0.4 / dVar41) + uVar36;
          if ((int)uVar34 < (int)uVar15) {
            uVar15 = uVar34;
          }
        }
        else {
          dVar40 = 1.0 - dVar40;
          if (dVar40 <= 0.01) {
            dVar40 = 0.01;
          }
          uVar16 = (int)(0.4 / dVar40) + uVar34;
          if ((int)uVar36 < (int)uVar16) {
            uVar16 = uVar36;
          }
        }
      }
    }
  }
  iVar17 = (uint)bVar37 * 2 + 1;
  uVar33 = uVar15 + uVar16 + 1;
  if (0 < (int)uVar33) {
    uVar35 = 0;
    do {
      plVar20 = av1_lookahead_peek(cpi->ppi->lookahead,
                                   (filter_frame_lookahead_idx - uVar15) + (int)uVar35,
                                   cpi->compressor_stage);
      (cpi->tf_ctx).frames[uVar35] = &plVar20->img;
      uVar35 = uVar35 + 1;
    } while (uVar33 != uVar35);
  }
  pTVar1 = &(cpi->td).tf_data;
  (cpi->tf_ctx).num_frames = uVar33;
  (cpi->tf_ctx).filter_frame_idx = uVar15;
  av1_setup_src_planes(&(cpi->td).mb,&frame->img,0,0,iVar17,((cpi->common).seq_params)->sb_size);
  pSVar6 = (cpi->common).seq_params;
  av1_setup_block_planes(&(cpi->td).mb.e_mbd,pSVar6->subsampling_x,pSVar6->subsampling_y,iVar17);
  sf = &(cpi->tf_ctx).sf;
  pYVar7 = (cpi->tf_ctx).frames[0];
  iVar17 = (pYVar7->field_2).field_0.y_crop_width;
  iVar39 = (pYVar7->field_3).field_0.y_crop_height;
  av1_setup_scale_factors_for_frame(sf,iVar17,iVar39,iVar17,iVar39);
  pYVar7 = (cpi->tf_ctx).frames[(cpi->tf_ctx).filter_frame_idx];
  uVar33 = pYVar7->flags;
  pSVar6 = (cpi->common).seq_params;
  piVar32 = &(cpi->td).mb.e_mbd.plane[0].subsampling_y;
  iVar17 = 0;
  uVar35 = 0;
  do {
    iVar17 = (0x400U >> ((char)*piVar32 + (char)piVar32[-1] & 0x1fU)) + iVar17;
    if (pSVar6->monochrome != '\0') break;
    piVar32 = piVar32 + 0x28c;
    bVar37 = uVar35 < 2;
    uVar35 = uVar35 + 1;
  } while (bVar37);
  iVar39 = (pYVar7->field_3).field_0.y_crop_height + 0x1f;
  iVar14 = (pYVar7->field_2).field_0.y_crop_width + 0x1f;
  (cpi->tf_ctx).num_pels = iVar17;
  (cpi->tf_ctx).mb_rows = (int)(((uint)(iVar39 >> 0x1f) >> 0x1b) + iVar39) >> 5;
  (cpi->tf_ctx).mb_cols = (int)(((uint)(iVar14 >> 0x1f) >> 0x1b) + iVar14) >> 5;
  (cpi->tf_ctx).is_highbitdepth = uVar33 >> 3 & 1;
  dVar38 = av1_convert_qindex_to_q
                     ((cpi->ppi->p_rc).avg_frame_qindex
                      [(cpi->ppi->gf_group).frame_type[cpi->gf_frame_index]],pSVar6->bit_depth);
  (cpi->tf_ctx).q_factor = (int)dVar38;
  iVar17 = (cpi->tf_ctx).is_highbitdepth;
  iVar39 = (cpi->tf_ctx).num_pels;
  size = (size_t)iVar39;
  pMVar21 = (MB_MODE_INFO *)aom_calloc(1,0xb0);
  (cpi->td).tf_data.tmp_mbmi = pMVar21;
  puVar22 = (uint32_t *)aom_memalign(0x10,size * 4);
  (cpi->td).tf_data.accum = puVar22;
  puVar23 = (uint16_t *)aom_memalign(0x10,size * 2);
  (cpi->td).tf_data.count = puVar23;
  if (iVar17 == 0) {
    puVar25 = (uint8_t *)aom_memalign(0x20,size);
  }
  else {
    pvVar24 = aom_memalign(0x20,(long)(iVar39 * 2));
    puVar25 = (uint8_t *)((ulong)pvVar24 >> 1);
  }
  (cpi->td).tf_data.pred = puVar25;
  if ((((cpi->td).tf_data.tmp_mbmi == (MB_MODE_INFO *)0x0) ||
      ((cpi->td).tf_data.accum == (uint32_t *)0x0)) ||
     (((cpi->td).tf_data.count == (uint16_t *)0x0 || (puVar25 == (uint8_t *)0x0)))) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                       "Error allocating temporal filter data");
  }
  else {
    (pTVar1->diff).sum = 0;
    (cpi->td).tf_data.diff.sse = 0;
  }
  if ((cpi->mt_info).num_workers < 2) {
    lVar31 = (ulong)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1;
    pbVar26 = (cpi->td).mb.e_mbd.plane[0].pre;
    lVar27 = 0;
    do {
      auStack_48[lVar27] = pbVar26->buf;
      lVar27 = lVar27 + 1;
      pbVar26 = (buf_2d *)((long)(pbVar26 + 0x51) + 0x10);
    } while (lVar31 != lVar27);
    ppMVar8 = (cpi->td).mb.e_mbd.mi;
    (cpi->td).mb.e_mbd.block_ref_scale_factors[0] = sf;
    (cpi->td).mb.e_mbd.block_ref_scale_factors[1] = sf;
    (cpi->td).mb.e_mbd.mi = &(cpi->td).tf_data.tmp_mbmi;
    ((cpi->td).tf_data.tmp_mbmi)->motion_mode = '\0';
    if (0 < (cpi->tf_ctx).mb_rows) {
      iVar39 = 0;
      do {
        av1_tf_do_filtering_row(cpi,&cpi->td,iVar39);
        iVar39 = iVar39 + 1;
      } while (iVar39 < (cpi->tf_ctx).mb_rows);
    }
    pbVar26 = (cpi->td).mb.e_mbd.plane[0].pre;
    lVar27 = 0;
    do {
      pbVar26->buf = (uint8_t *)auStack_48[lVar27];
      lVar27 = lVar27 + 1;
      pbVar26 = (buf_2d *)((long)(pbVar26 + 0x51) + 0x10);
    } while (lVar31 != lVar27);
    (cpi->td).mb.e_mbd.mi = ppMVar8;
  }
  else {
    av1_tf_do_filtering_mt(cpi);
  }
  if (frame_diff != (FRAME_DIFF *)0x0) {
    iVar11 = (cpi->td).tf_data.diff.sse;
    frame_diff->sum = (pTVar1->diff).sum;
    frame_diff->sse = iVar11;
  }
  if (iVar17 != 0) {
    ppuVar2 = &(cpi->td).tf_data.pred;
    *ppuVar2 = (uint8_t *)((long)*ppuVar2 << 1);
  }
  aom_free((cpi->td).tf_data.tmp_mbmi);
  (cpi->td).tf_data.tmp_mbmi = (MB_MODE_INFO *)0x0;
  aom_free((cpi->td).tf_data.accum);
  (cpi->td).tf_data.accum = (uint32_t *)0x0;
  aom_free((cpi->td).tf_data.count);
  (cpi->td).tf_data.count = (uint16_t *)0x0;
  aom_free((cpi->td).tf_data.pred);
  (cpi->td).tf_data.pred = (uint8_t *)0x0;
  return;
}

Assistant:

void av1_temporal_filter(AV1_COMP *cpi, const int filter_frame_lookahead_idx,
                         int gf_frame_index, FRAME_DIFF *frame_diff,
                         YV12_BUFFER_CONFIG *output_frame) {
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  // Basic informaton of the current frame.
  TemporalFilterCtx *tf_ctx = &cpi->tf_ctx;
  TemporalFilterData *tf_data = &cpi->td.tf_data;
  const int compute_frame_diff = frame_diff != NULL;
  // TODO(anyone): Currently, we enforce the filtering strength on internal
  // ARFs except the second ARF to be zero. We should investigate in which case
  // it is more beneficial to use non-zero strength filtering.
  // Only parallel level 0 frames go through temporal filtering.
  assert(cpi->ppi->gf_group.frame_parallel_level[gf_frame_index] == 0);

  // Initialize temporal filter context structure.
  init_tf_ctx(cpi, filter_frame_lookahead_idx, gf_frame_index,
              compute_frame_diff, output_frame);

  // Allocate and reset temporal filter buffers.
  const int is_highbitdepth = tf_ctx->is_highbitdepth;
  if (!tf_alloc_and_reset_data(tf_data, tf_ctx->num_pels, is_highbitdepth)) {
    aom_internal_error(cpi->common.error, AOM_CODEC_MEM_ERROR,
                       "Error allocating temporal filter data");
  }

  // Perform temporal filtering process.
  if (mt_info->num_workers > 1)
    av1_tf_do_filtering_mt(cpi);
  else
    tf_do_filtering(cpi);

  if (compute_frame_diff) {
    *frame_diff = tf_data->diff;
  }
  // Deallocate temporal filter buffers.
  tf_dealloc_data(tf_data, is_highbitdepth);
}